

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_or_null.cpp
# Opt level: O2

ScalarFunction * duckdb::ConstantOrNullFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  FunctionNullHandling in_stack_ffffffffffffff30;
  allocator_type local_ca;
  allocator local_c9;
  code *bind_lambda;
  LogicalType local_a8;
  LogicalType local_90 [2];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"constant_or_null",&local_c9);
  LogicalType::LogicalType(local_90,ANY);
  LogicalType::LogicalType(local_90 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_90;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_ca);
  LogicalType::LogicalType(&local_a8,ANY);
  bind_lambda = ConstantOrNullFunction;
  LogicalType::LogicalType(&local_48,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_48;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff24;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_60,&local_a8,
             (scalar_function_t *)&stack0xffffffffffffff38,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff30,bind_lambda);
  LogicalType::~LogicalType(&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff38);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_90[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_30);
  in_RDI->bind = ConstantOrNullBind;
  LogicalType::LogicalType(local_90,ANY);
  LogicalType::operator=(&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,local_90);
  LogicalType::~LogicalType(local_90);
  return in_RDI;
}

Assistant:

ScalarFunction ConstantOrNullFun::GetFunction() {
	auto fun = ScalarFunction("constant_or_null", {LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY,
	                          ConstantOrNullFunction);
	fun.bind = ConstantOrNullBind;
	fun.varargs = LogicalType::ANY;
	return fun;
}